

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::test_array8_int8_empty(void)

{
  value_type input [2];
  decoder decoder;
  value local_64;
  uchar local_5e [2];
  undefined4 local_5c;
  decoder local_58;
  
  local_5e[0] = 0xa8;
  local_5e[1] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>(&local_58,&local_5e);
  local_64 = local_58.current.code;
  local_5c = 0xa8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array8_int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x555,"void compact_int8_suite::test_array8_int8_empty()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_5c = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x556,"void compact_int8_suite::test_array8_int8_empty()",&local_64,&local_5c);
  local_64 = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x557,"void compact_int8_suite::test_array8_int8_empty()",&local_64,&local_5c);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x558,"void compact_int8_suite::test_array8_int8_empty()",
             local_58.current.view._M_len == 0);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_64 = local_58.current.code;
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x55a,"void compact_int8_suite::test_array8_int8_empty()",&local_64,&local_5c);
  return;
}

Assistant:

void test_array8_int8_empty()
{
    const value_type input[] = { token::code::array8_int8, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array8_int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}